

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O2

void __thiscall Assimp::ColladaParser::ReadLight(ColladaParser *this,Light *pLight)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pName;
  ai_real aVar3;
  char *content;
  ai_real *local_48;
  ai_real *local_40;
  aiColor3D *local_38;
  
  local_38 = &pLight->mColor;
  local_40 = &(pLight->mColor).g;
  local_48 = &(pLight->mColor).b;
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              while( true ) {
                while( true ) {
                  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
                  if ((char)iVar2 == '\0') {
                    return;
                  }
                  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
                  if (iVar2 == 1) break;
                  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
                  if (iVar2 == 2) {
                    iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                    iVar2 = strcmp((char *)CONCAT44(extraout_var,iVar2),"light");
                    if (iVar2 == 0) {
                      return;
                    }
                  }
                }
                bVar1 = IsElement(this,"light");
                if (!bVar1) break;
                SkipElement(this);
              }
              bVar1 = IsElement(this,"spot");
              if (!bVar1) break;
              pLight->mType = 3;
            }
            bVar1 = IsElement(this,"ambient");
            if (!bVar1) break;
            pLight->mType = 4;
          }
          bVar1 = IsElement(this,"directional");
          if (!bVar1) break;
          pLight->mType = 1;
        }
        bVar1 = IsElement(this,"point");
        if (!bVar1) break;
        pLight->mType = 2;
      }
      bVar1 = IsElement(this,"color");
      if (!bVar1) break;
      content = GetTextContent(this);
      content = fast_atoreal_move<float>(content,&local_38->r,true);
      SkipSpacesAndLineEnd<char>(&content);
      content = fast_atoreal_move<float>(content,local_40,true);
      SkipSpacesAndLineEnd<char>(&content);
      content = fast_atoreal_move<float>(content,local_48,true);
      SkipSpacesAndLineEnd<char>(&content);
      pName = "color";
LAB_004010da:
      TestClosing(this,pName);
    }
    bVar1 = IsElement(this,"constant_attenuation");
    if (bVar1) {
      aVar3 = ReadFloatFromTextContent(this);
      pLight->mAttConstant = aVar3;
      pName = "constant_attenuation";
      goto LAB_004010da;
    }
    bVar1 = IsElement(this,"linear_attenuation");
    if (bVar1) {
      aVar3 = ReadFloatFromTextContent(this);
      pLight->mAttLinear = aVar3;
      TestClosing(this,"linear_attenuation");
    }
    else {
      bVar1 = IsElement(this,"quadratic_attenuation");
      if (bVar1) {
        aVar3 = ReadFloatFromTextContent(this);
        pLight->mAttQuadratic = aVar3;
        TestClosing(this,"quadratic_attenuation");
      }
      else {
        bVar1 = IsElement(this,"falloff_angle");
        if (bVar1) {
          aVar3 = ReadFloatFromTextContent(this);
          pLight->mFalloffAngle = aVar3;
          TestClosing(this,"falloff_angle");
        }
        else {
          bVar1 = IsElement(this,"falloff_exponent");
          if (bVar1) {
            aVar3 = ReadFloatFromTextContent(this);
            pLight->mFalloffExponent = aVar3;
            TestClosing(this,"falloff_exponent");
          }
          else {
            bVar1 = IsElement(this,"outer_cone");
            if (bVar1) {
              aVar3 = ReadFloatFromTextContent(this);
              pLight->mOuterAngle = aVar3;
              TestClosing(this,"outer_cone");
            }
            else {
              bVar1 = IsElement(this,"penumbra_angle");
              if (bVar1) {
                aVar3 = ReadFloatFromTextContent(this);
                pLight->mPenumbraAngle = aVar3;
                TestClosing(this,"penumbra_angle");
              }
              else {
                bVar1 = IsElement(this,"intensity");
                if (bVar1) {
                  aVar3 = ReadFloatFromTextContent(this);
                  pLight->mIntensity = aVar3;
                  TestClosing(this,"intensity");
                }
                else {
                  bVar1 = IsElement(this,"falloff");
                  if (bVar1) {
                    aVar3 = ReadFloatFromTextContent(this);
                    pLight->mOuterAngle = aVar3;
                    TestClosing(this,"falloff");
                  }
                  else {
                    bVar1 = IsElement(this,"hotspot_beam");
                    if (bVar1) {
                      aVar3 = ReadFloatFromTextContent(this);
                      pLight->mFalloffAngle = aVar3;
                      TestClosing(this,"hotspot_beam");
                    }
                    else {
                      bVar1 = IsElement(this,"decay_falloff");
                      if (bVar1) {
                        aVar3 = ReadFloatFromTextContent(this);
                        pLight->mOuterAngle = aVar3;
                        TestClosing(this,"decay_falloff");
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  } while( true );
}

Assistant:

void ColladaParser::ReadLight(Collada::Light& pLight)
{
    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT) {
            if (IsElement("light")) {
                SkipElement();
            }
            else if (IsElement("spot")) {
                pLight.mType = aiLightSource_SPOT;
            }
            else if (IsElement("ambient")) {
                pLight.mType = aiLightSource_AMBIENT;
            }
            else if (IsElement("directional")) {
                pLight.mType = aiLightSource_DIRECTIONAL;
            }
            else if (IsElement("point")) {
                pLight.mType = aiLightSource_POINT;
            }
            else if (IsElement("color")) {
                // text content contains 3 floats
                const char* content = GetTextContent();

                content = fast_atoreal_move<ai_real>(content, (ai_real&)pLight.mColor.r);
                SkipSpacesAndLineEnd(&content);

                content = fast_atoreal_move<ai_real>(content, (ai_real&)pLight.mColor.g);
                SkipSpacesAndLineEnd(&content);

                content = fast_atoreal_move<ai_real>(content, (ai_real&)pLight.mColor.b);
                SkipSpacesAndLineEnd(&content);

                TestClosing("color");
            }
            else if (IsElement("constant_attenuation")) {
                pLight.mAttConstant = ReadFloatFromTextContent();
                TestClosing("constant_attenuation");
            }
            else if (IsElement("linear_attenuation")) {
                pLight.mAttLinear = ReadFloatFromTextContent();
                TestClosing("linear_attenuation");
            }
            else if (IsElement("quadratic_attenuation")) {
                pLight.mAttQuadratic = ReadFloatFromTextContent();
                TestClosing("quadratic_attenuation");
            }
            else if (IsElement("falloff_angle")) {
                pLight.mFalloffAngle = ReadFloatFromTextContent();
                TestClosing("falloff_angle");
            }
            else if (IsElement("falloff_exponent")) {
                pLight.mFalloffExponent = ReadFloatFromTextContent();
                TestClosing("falloff_exponent");
            }
            // FCOLLADA extensions
            // -------------------------------------------------------
            else if (IsElement("outer_cone")) {
                pLight.mOuterAngle = ReadFloatFromTextContent();
                TestClosing("outer_cone");
            }
            // ... and this one is even deprecated
            else if (IsElement("penumbra_angle")) {
                pLight.mPenumbraAngle = ReadFloatFromTextContent();
                TestClosing("penumbra_angle");
            }
            else if (IsElement("intensity")) {
                pLight.mIntensity = ReadFloatFromTextContent();
                TestClosing("intensity");
            }
            else if (IsElement("falloff")) {
                pLight.mOuterAngle = ReadFloatFromTextContent();
                TestClosing("falloff");
            }
            else if (IsElement("hotspot_beam")) {
                pLight.mFalloffAngle = ReadFloatFromTextContent();
                TestClosing("hotspot_beam");
            }
            // OpenCOLLADA extensions
            // -------------------------------------------------------
            else if (IsElement("decay_falloff")) {
                pLight.mOuterAngle = ReadFloatFromTextContent();
                TestClosing("decay_falloff");
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END) {
            if (strcmp(mReader->getNodeName(), "light") == 0)
                break;
        }
    }
}